

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

Matrix<double,_4,_4> * gl4cts::Math::transpose<double,4,4>(Matrix<double,_4,_4> *matrix)

{
  undefined4 *puVar1;
  undefined4 *puVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  Matrix<double,_4,_4> *res;
  long lVar5;
  double *pdVar6;
  int row;
  Matrix<double,_4,_4> *result;
  long lVar7;
  long lVar8;
  uint uVar9;
  
  *(undefined8 *)((long)res + 0x70) = 0;
  *(undefined8 *)((long)res + 0x78) = 0;
  *(undefined8 *)((long)res + 0x60) = 0;
  *(undefined8 *)((long)res + 0x68) = 0;
  *(undefined8 *)((long)res + 0x50) = 0;
  *(undefined8 *)((long)res + 0x58) = 0;
  *(undefined8 *)((long)res + 0x40) = 0;
  *(undefined8 *)((long)res + 0x48) = 0;
  *(undefined8 *)((long)res + 0x30) = 0;
  *(undefined8 *)((long)res + 0x38) = 0;
  *(undefined8 *)((long)res + 0x20) = 0;
  *(undefined8 *)((long)res + 0x28) = 0;
  *(double *)((long)res + 0x10) = 0.0;
  *(undefined8 *)((long)res + 0x18) = 0;
  *(double *)res = 0.0;
  *(double *)((long)res + 8) = 0.0;
  lVar5 = 0;
  lVar7 = 0;
  pdVar6 = (double *)res;
  do {
    lVar8 = 0;
    do {
      uVar9 = 0x3ff00000;
      if (lVar5 != lVar8) {
        uVar9 = 0;
      }
      *(ulong *)((long)pdVar6 + lVar8) = (ulong)uVar9 << 0x20;
      lVar8 = lVar8 + 0x20;
    } while (lVar8 != 0x80);
    lVar7 = lVar7 + 1;
    pdVar6 = pdVar6 + 1;
    lVar5 = lVar5 + 0x20;
  } while (lVar7 != 4);
  lVar5 = 0;
  do {
    puVar1 = (undefined4 *)((long)(matrix->m_data).m_data[0].m_data + lVar5);
    uVar4 = puVar1[1];
    uVar3 = *(undefined8 *)((long)(matrix->m_data).m_data[1].m_data + lVar5);
    puVar2 = (undefined4 *)((long)res + lVar5 * 4);
    *puVar2 = *puVar1;
    puVar2[1] = uVar4;
    puVar2[2] = (int)uVar3;
    puVar2[3] = (int)((ulong)uVar3 >> 0x20);
    puVar1 = (undefined4 *)((long)(matrix->m_data).m_data[2].m_data + lVar5);
    uVar4 = puVar1[1];
    uVar3 = *(undefined8 *)((long)(matrix->m_data).m_data[3].m_data + lVar5);
    puVar2 = (undefined4 *)((long)res + lVar5 * 4 + 0x10);
    *puVar2 = *puVar1;
    puVar2[1] = uVar4;
    puVar2[2] = (int)uVar3;
    puVar2[3] = (int)((ulong)uVar3 >> 0x20);
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x20);
  return res;
}

Assistant:

static tcu::Matrix<T, Cols, Rows> transpose(const tcu::Matrix<T, Rows, Cols>& matrix)
{
	tcu::Matrix<T, Cols, Rows> result = tcu::transpose(matrix);

	return result;
}